

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcaf_fold_regex(int n,mpc_val_t **xs)

{
  mpc_val_t *x;
  char *__s;
  mpc_val_t *pmVar1;
  char *pcVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *local_48;
  uint local_3c;
  int mode;
  mpc_parser_t *p;
  mpca_grammar_st_t *st;
  char *m;
  char *y;
  mpc_val_t **xs_local;
  int n_local;
  
  x = *xs;
  __s = (char *)xs[1];
  pmVar1 = xs[2];
  pcVar2 = strchr(__s,0x6d);
  local_3c = (uint)(pcVar2 != (char *)0x0);
  pcVar2 = strchr(__s,0x73);
  if (pcVar2 != (char *)0x0) {
    local_3c = local_3c | 2;
  }
  pcVar2 = (char *)mpcf_unescape_regex(x);
  if ((*(uint *)((long)pmVar1 + 0x18) & 2) == 0) {
    pmVar3 = mpc_re_mode(pcVar2,local_3c);
    local_48 = mpc_tok(pmVar3);
  }
  else {
    local_48 = mpc_re_mode(pcVar2,local_3c);
  }
  free(pcVar2);
  free(__s);
  pmVar3 = mpc_apply(local_48,mpcf_str_ast);
  pmVar3 = mpca_tag(pmVar3,"regex");
  pmVar3 = mpca_state(pmVar3);
  return pmVar3;
}

Assistant:

static mpc_val_t *mpcaf_fold_regex(int n, mpc_val_t **xs) {
  char *y = xs[0];
  char *m = xs[1];
  mpca_grammar_st_t *st = xs[2];
  mpc_parser_t *p;
  int mode = MPC_RE_DEFAULT;

  (void)n;
  if (strchr(m, 'm')) { mode |= MPC_RE_MULTILINE; }
  if (strchr(m, 's')) { mode |= MPC_RE_DOTALL; }
  y = mpcf_unescape_regex(y);
  p = (st->flags & MPCA_LANG_WHITESPACE_SENSITIVE) ? mpc_re_mode(y, mode) : mpc_tok(mpc_re_mode(y, mode));
  free(y);
  free(m);

  return mpca_state(mpca_tag(mpc_apply(p, mpcf_str_ast), "regex"));
}